

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void Fossilize::StreamArchive::convert_to_le(uint8_t *le_output,uint32_t *value_input,uint count)

{
  ulong uVar1;
  
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    *(uint32_t *)(le_output + uVar1 * 4) = value_input[uVar1];
  }
  return;
}

Assistant:

static void convert_to_le(uint8_t *le_output, const uint32_t *value_input, unsigned count)
	{
		for (unsigned i = 0; i < count; i++)
		{
			uint32_t v = value_input[i];
			*le_output++ = uint8_t((v >> 0) & 0xffu);
			*le_output++ = uint8_t((v >> 8) & 0xffu);
			*le_output++ = uint8_t((v >> 16) & 0xffu);
			*le_output++ = uint8_t((v >> 24) & 0xffu);
		}
	}